

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O0

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  auto_ptr_ref<cmFunctionBlocker> r;
  cmFunctionBlocker *pcVar4;
  size_type sVar5;
  cmake *pcVar6;
  reference pvVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 local_118 [8];
  cmListFileBacktrace bt;
  string err;
  undefined1 local_c0 [7];
  bool isTrue;
  cmConditionEvaluator conditionEvaluator;
  undefined1 local_a0 [4];
  MessageType messType;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  int local_60;
  uint c;
  int scopeDepth;
  cmExecutionStatus local_50;
  uint local_4c;
  cmExecutionStatus status;
  auto_ptr<cmFunctionBlocker> local_38;
  auto_ptr<cmFunctionBlocker> fb;
  cmExecutionStatus *inStatus_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmIfFunctionBlocker *this_local;
  
  fb.x_ = (cmFunctionBlocker *)inStatus;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"if");
  if (iVar2 == 0) {
    this->ScopeDepth = this->ScopeDepth + 1;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"endif");
    if ((iVar2 == 0) && (this->ScopeDepth = this->ScopeDepth - 1, this->ScopeDepth == 0)) {
      cmMakefile::RemoveFunctionBlocker
                ((cmMakefile *)&status,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
      r = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&status);
      cmsys::auto_ptr<cmFunctionBlocker>::auto_ptr(&local_38,r);
      cmsys::auto_ptr<cmFunctionBlocker>::~auto_ptr((auto_ptr<cmFunctionBlocker> *)&status);
      pcVar4 = cmsys::auto_ptr<cmFunctionBlocker>::get(&local_38);
      if (pcVar4 == (cmFunctionBlocker *)0x0) {
        this_local._7_1_ = 0;
        local_4c = 1;
      }
      else {
        cmExecutionStatus::cmExecutionStatus(&local_50);
        local_60 = 0;
        for (errorString.field_2._12_4_ = 0;
            sVar5 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                              (&this->Functions), (uint)errorString.field_2._12_4_ < sVar5;
            errorString.field_2._12_4_ = errorString.field_2._12_4_ + 1) {
          std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                    (&this->Functions,(ulong)(uint)errorString.field_2._12_4_);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"if");
          if (iVar2 == 0) {
            local_60 = local_60 + 1;
          }
          std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                    (&this->Functions,(ulong)(uint)errorString.field_2._12_4_);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"endif");
          if (iVar2 == 0) {
            local_60 = local_60 + -1;
          }
          if (local_60 == 0) {
            std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                      (&this->Functions,(ulong)(uint)errorString.field_2._12_4_);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"else");
            if (iVar2 != 0) goto LAB_0050d552;
            this->IsBlocking = (bool)(this->HasRun & 1);
            this->HasRun = true;
            if ((this->IsBlocking & 1U) == 0) {
              pcVar6 = cmMakefile::GetCMakeInstance(mf);
              bVar1 = cmake::GetTrace(pcVar6);
              if (bVar1) {
                pvVar7 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                         operator[](&this->Functions,(ulong)(uint)errorString.field_2._12_4_);
                cmMakefile::PrintCommandTrace(mf,pvVar7);
              }
            }
          }
          else {
LAB_0050d552:
            if (local_60 == 0) {
              std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                        (&this->Functions,(ulong)(uint)errorString.field_2._12_4_);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              iVar2 = cmsys::SystemTools::Strucmp(pcVar3,"elseif");
              if (iVar2 == 0) {
                if ((this->HasRun & 1U) != 0) {
                  this->IsBlocking = true;
                  goto LAB_0050d96e;
                }
                pcVar6 = cmMakefile::GetCMakeInstance(mf);
                bVar1 = cmake::GetTrace(pcVar6);
                if (bVar1) {
                  pvVar7 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                           operator[](&this->Functions,(ulong)(uint)errorString.field_2._12_4_);
                  cmMakefile::PrintCommandTrace(mf,pvVar7);
                }
                std::__cxx11::string::string
                          ((string *)
                           &expandedArguments.
                            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        *)local_a0);
                pvVar7 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                         operator[](&this->Functions,(ulong)(uint)errorString.field_2._12_4_);
                cmMakefile::ExpandArguments
                          (mf,&pvVar7->Arguments,
                           (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            *)local_a0,(char *)0x0);
                cmConditionEvaluator::cmConditionEvaluator((cmConditionEvaluator *)local_c0,mf);
                bVar1 = cmConditionEvaluator::IsTrue
                                  ((cmConditionEvaluator *)local_c0,
                                   (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                    *)local_a0,
                                   (string *)
                                   &expandedArguments.
                                    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (MessageType *)&conditionEvaluator.field_0x14);
                uVar8 = std::__cxx11::string::empty();
                if ((uVar8 & 1) == 0) {
                  cmIfCommandError_abi_cxx11_
                            ((string *)&bt.Snapshot.Position.Position,
                             (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                              *)local_a0);
                  std::__cxx11::string::operator+=
                            ((string *)&bt.Snapshot.Position.Position,
                             (string *)
                             &expandedArguments.
                              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  pvVar7 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                           operator[](&this->Functions,(ulong)(uint)errorString.field_2._12_4_);
                  cmMakefile::GetBacktrace
                            ((cmListFileBacktrace *)local_118,mf,&pvVar7->super_cmListFileContext);
                  pcVar6 = cmMakefile::GetCMakeInstance(mf);
                  cmake::IssueMessage(pcVar6,conditionEvaluator._20_4_,
                                      (string *)&bt.Snapshot.Position.Position,
                                      (cmListFileBacktrace *)local_118);
                  bVar9 = conditionEvaluator._20_4_ == 1;
                  if (bVar9) {
                    cmSystemTools::SetFatalErrorOccured();
                    this_local._7_1_ = 1;
                  }
                  local_4c = (uint)bVar9;
                  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_118);
                  std::__cxx11::string::~string((string *)&bt.Snapshot.Position.Position);
                  if (local_4c == 0) goto LAB_0050d7fb;
                }
                else {
LAB_0050d7fb:
                  if (bVar1) {
                    this->IsBlocking = false;
                    this->HasRun = true;
                  }
                  local_4c = 0;
                }
                std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                ~vector((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                         *)local_a0);
                std::__cxx11::string::~string
                          ((string *)
                           &expandedArguments.
                            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if (local_4c == 0) goto LAB_0050d96e;
                goto LAB_0050d989;
              }
            }
            if ((this->IsBlocking & 1U) == 0) {
              cmExecutionStatus::Clear(&local_50);
              pvVar7 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::
                       operator[](&this->Functions,(ulong)(uint)errorString.field_2._12_4_);
              cmMakefile::ExecuteCommand(mf,pvVar7,&local_50);
              bVar1 = cmExecutionStatus::GetReturnInvoked(&local_50);
              if (bVar1) {
                cmExecutionStatus::SetReturnInvoked((cmExecutionStatus *)fb.x_,true);
                this_local._7_1_ = 1;
                local_4c = 1;
                goto LAB_0050d989;
              }
              bVar1 = cmExecutionStatus::GetBreakInvoked(&local_50);
              if (bVar1) {
                cmExecutionStatus::SetBreakInvoked((cmExecutionStatus *)fb.x_,true);
                this_local._7_1_ = 1;
                local_4c = 1;
                goto LAB_0050d989;
              }
              bVar1 = cmExecutionStatus::GetContinueInvoked(&local_50);
              if (bVar1) {
                cmExecutionStatus::SetContinueInvoked((cmExecutionStatus *)fb.x_,true);
                this_local._7_1_ = 1;
                local_4c = 1;
                goto LAB_0050d989;
              }
            }
          }
LAB_0050d96e:
        }
        this_local._7_1_ = 1;
        local_4c = 1;
      }
LAB_0050d989:
      cmsys::auto_ptr<cmFunctionBlocker>::~auto_ptr(&local_38);
      goto LAB_0050d9bb;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  this_local._7_1_ = 1;
LAB_0050d9bb:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmIfFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff,
                  cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  // we start by recording all the functions
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"if"))
    {
    this->ScopeDepth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endif"))
    {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for(unsigned int c = 0; c < this->Functions.size(); ++c)
        {
        // keep track of scope depth
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"if"))
          {
          scopeDepth++;
          }
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"endif"))
          {
          scopeDepth--;
          }
        // watch for our state change
        if (scopeDepth == 0 &&
            !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"else"))
          {
          this->IsBlocking = this->HasRun;
          this->HasRun = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if(!this->IsBlocking && mf.GetCMakeInstance()->GetTrace())
            {
            mf.PrintCommandTrace(this->Functions[c]);
            }
          }
        else if (scopeDepth == 0 && !cmSystemTools::Strucmp
                 (this->Functions[c].Name.c_str(),"elseif"))
          {
          if (this->HasRun)
            {
            this->IsBlocking = true;
            }
          else
            {
            // if trace is enabled, print the evaluated "elseif" statement
            if(mf.GetCMakeInstance()->GetTrace())
              {
              mf.PrintCommandTrace(this->Functions[c]);
              }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(this->Functions[c].Arguments,
                               expandedArguments);

            cmake::MessageType messType;

            cmConditionEvaluator conditionEvaluator(mf);

            bool isTrue = conditionEvaluator.IsTrue(
              expandedArguments, errorString, messType);

            if (!errorString.empty())
              {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == cmake::FATAL_ERROR)
                {
                cmSystemTools::SetFatalErrorOccured();
                return true;
                }
              }

            if (isTrue)
              {
              this->IsBlocking = false;
              this->HasRun = true;
              }
            }
          }

        // should we execute?
        else if (!this->IsBlocking)
          {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            return true;
            }
          if (status.GetBreakInvoked())
            {
            inStatus.SetBreakInvoked(true);
            return true;
            }
          if (status.GetContinueInvoked())
            {
            inStatus.SetContinueInvoked(true);
            return true;
            }
          }
        }
      return true;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}